

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O1

int Saig_ManDemiterSimpleDiff(Aig_Man_t *p,Aig_Man_t **ppAig0,Aig_Man_t **ppAig1)

{
  uint uVar1;
  uint uVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  int iVar5;
  Vec_Ptr_t *vSet;
  void **ppvVar6;
  Vec_Ptr_t *vSet_00;
  Aig_Man_t *pAVar7;
  char *pcVar8;
  int iVar9;
  long lVar10;
  Aig_Obj_t *pObj1;
  Aig_Obj_t *pObj0;
  Aig_Obj_t *local_40;
  Aig_Obj_t *local_38;
  
  iVar5 = 0;
  if ((p->nRegs & 1U) == 0 && p->nRegs != 0) {
    Saig_ManDemiterMarkPos(p);
    iVar5 = p->nTruePos;
    vSet = (Vec_Ptr_t *)malloc(0x10);
    iVar9 = 8;
    if (6 < iVar5 - 1U) {
      iVar9 = iVar5;
    }
    vSet->nSize = 0;
    vSet->nCap = iVar9;
    if (iVar9 == 0) {
      ppvVar6 = (void **)0x0;
    }
    else {
      ppvVar6 = (void **)malloc((long)iVar9 * 8);
    }
    vSet->pArray = ppvVar6;
    vSet_00 = (Vec_Ptr_t *)malloc(0x10);
    vSet_00->nSize = 0;
    vSet_00->nCap = iVar9;
    if (iVar9 == 0) {
      ppvVar6 = (void **)0x0;
    }
    else {
      ppvVar6 = (void **)malloc((long)iVar9 << 3);
    }
    vSet_00->pArray = ppvVar6;
    if (0 < p->nTruePos) {
      lVar10 = 0;
      do {
        if (p->vCos->nSize <= lVar10) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        iVar5 = Saig_ManDemiterCheckPo(p,(Aig_Obj_t *)p->vCos->pArray[lVar10],&local_38,&local_40);
        pAVar4 = local_38;
        if (iVar5 == 0) {
          if (vSet->pArray != (void **)0x0) {
            free(vSet->pArray);
            vSet->pArray = (void **)0x0;
          }
          free(vSet);
          ppvVar6 = vSet_00->pArray;
          iVar5 = 0;
          goto LAB_006e2676;
        }
        uVar1 = vSet->nSize;
        uVar2 = vSet->nCap;
        if (uVar1 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (vSet->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(vSet->pArray,0x80);
            }
            iVar5 = 0x10;
          }
          else {
            iVar5 = uVar2 * 2;
            if (iVar5 <= (int)uVar2) goto LAB_006e24e0;
            if (vSet->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar6 = (void **)realloc(vSet->pArray,(ulong)uVar2 << 4);
            }
          }
          vSet->pArray = ppvVar6;
          vSet->nCap = iVar5;
        }
LAB_006e24e0:
        pAVar3 = local_40;
        vSet->nSize = uVar1 + 1;
        vSet->pArray[(int)uVar1] = pAVar4;
        uVar1 = vSet_00->nSize;
        uVar2 = vSet_00->nCap;
        if (uVar1 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (vSet_00->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(vSet_00->pArray,0x80);
            }
            iVar5 = 0x10;
          }
          else {
            iVar5 = uVar2 * 2;
            if (iVar5 <= (int)uVar2) goto LAB_006e2552;
            if (vSet_00->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar6 = (void **)realloc(vSet_00->pArray,(ulong)uVar2 << 4);
            }
          }
          vSet_00->pArray = ppvVar6;
          vSet_00->nCap = iVar5;
        }
LAB_006e2552:
        vSet_00->nSize = uVar1 + 1;
        vSet_00->pArray[(int)uVar1] = pAVar3;
        lVar10 = lVar10 + 1;
      } while (lVar10 < p->nTruePos);
    }
    pAVar7 = Aig_ManDupNodesHalf(p,vSet,0);
    *ppAig0 = pAVar7;
    if (pAVar7->pName != (char *)0x0) {
      free(pAVar7->pName);
      (*ppAig0)->pName = (char *)0x0;
    }
    pcVar8 = (char *)malloc(6);
    builtin_strncpy(pcVar8,"part0",6);
    (*ppAig0)->pName = pcVar8;
    pAVar7 = Aig_ManDupNodesHalf(p,vSet_00,1);
    *ppAig1 = pAVar7;
    if (pAVar7->pName != (char *)0x0) {
      free(pAVar7->pName);
      (*ppAig1)->pName = (char *)0x0;
    }
    pcVar8 = (char *)malloc(6);
    builtin_strncpy(pcVar8,"part1",6);
    (*ppAig1)->pName = pcVar8;
    if (vSet->pArray != (void **)0x0) {
      free(vSet->pArray);
      vSet->pArray = (void **)0x0;
    }
    free(vSet);
    ppvVar6 = vSet_00->pArray;
    iVar5 = 1;
LAB_006e2676:
    if (ppvVar6 != (void **)0x0) {
      free(ppvVar6);
      vSet_00->pArray = (void **)0x0;
    }
    free(vSet_00);
    Aig_ManCleanMarkAB(p);
  }
  return iVar5;
}

Assistant:

int Saig_ManDemiterSimpleDiff( Aig_Man_t * p, Aig_Man_t ** ppAig0, Aig_Man_t ** ppAig1 )
{
    Vec_Ptr_t * vSet0, * vSet1;
    Aig_Obj_t * pObj, * pObj0, * pObj1;
    int i;
    if ( Aig_ManRegNum(p) == 0 || (Aig_ManRegNum(p) & 1) )
        return 0;
    Saig_ManDemiterMarkPos( p );
    vSet0 = Vec_PtrAlloc( Saig_ManPoNum(p) );
    vSet1 = Vec_PtrAlloc( Saig_ManPoNum(p) );
    Saig_ManForEachPo( p, pObj, i )
    {
        if ( !Saig_ManDemiterCheckPo( p, pObj, &pObj0, &pObj1 ) )
        {
            Vec_PtrFree( vSet0 );
            Vec_PtrFree( vSet1 );
            Aig_ManCleanMarkAB( p );
            return 0;
        }
        Vec_PtrPush( vSet0, pObj0 );
        Vec_PtrPush( vSet1, pObj1 );
    }
    // create new AIG
    *ppAig0 = Aig_ManDupNodesHalf( p, vSet0, 0 );
    ABC_FREE( (*ppAig0)->pName );
    (*ppAig0)->pName = Abc_UtilStrsav( "part0" );
    // create new AIGs
    *ppAig1 = Aig_ManDupNodesHalf( p, vSet1, 1 );
    ABC_FREE( (*ppAig1)->pName );
    (*ppAig1)->pName = Abc_UtilStrsav( "part1" );
    // cleanup
    Vec_PtrFree( vSet0 );
    Vec_PtrFree( vSet1 );
    Aig_ManCleanMarkAB( p );
    return 1;
}